

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_int32_t seqindex_decode_entry(utf8proc_uint16_t **entry)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  
  puVar2 = *entry;
  uVar1 = *puVar2;
  uVar3 = (uint)uVar1;
  if ((uVar1 & 0xf800) == 0xd800) {
    *entry = puVar2 + 1;
    uVar3 = (uVar1 & 0x3ff) * 0x400 + (puVar2[1] & 0x3ff) + 0x10000;
  }
  return uVar3;
}

Assistant:

static utf8proc_int32_t seqindex_decode_entry(const utf8proc_uint16_t **entry)
{
  utf8proc_int32_t entry_cp = **entry;
  if ((entry_cp & 0xF800) == 0xD800) {
    *entry = *entry + 1;
    entry_cp = ((entry_cp & 0x03FF) << 10) | (**entry & 0x03FF);
    entry_cp += 0x10000;
  }
  return entry_cp;
}